

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O1

void do_tests(_Bool do_random)

{
  list_entity **pplVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  list_entity *plVar6;
  list_entity *plVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 uVar11;
  char *pcVar12;
  undefined7 in_register_00000039;
  uint uVar13;
  tree_element *ptVar14;
  uint32_t i;
  uint32_t i_1;
  uint local_74;
  uint local_70;
  undefined4 local_6c;
  tree_element *local_68;
  list_entity *local_60;
  long local_58;
  long local_50;
  long local_48;
  undefined8 local_40;
  undefined4 local_34;
  
  uVar10 = CONCAT71(in_register_00000039,do_random);
  pcVar12 = "non ";
  if ((int)uVar10 != 0) {
    pcVar12 = "";
  }
  printf("Do %srandom tests.\n",pcVar12);
  cunit_start_test("test_insert_nondup");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,0);
  add_elements((tree_element *)(uVar10 & 0xffffffff),(_Bool)uVar11);
  cunit_named_check(head.count == 6,"test_insert_nondup",0xef,"tree not completely filled");
  check_tree("test_insert_nondup",0xf0);
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 != 0,"test_insert_nondup",0xf6,
                    "insert duplicate (in non-dup tree) was successful");
  cunit_named_check(head.count == 6,"test_insert_nondup",0xf8,
                    "tree not completely filled after insert");
  check_tree("test_insert_nondup",0xf9);
  cunit_end_test("test_insert_nondup");
  cunit_start_test("test_insert_dup");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(uVar10 & 0xffffffff),(_Bool)uVar11);
  cunit_named_check(head.count == 6,"test_insert_dup",0x103,"tree not completely filled");
  check_tree("test_insert_dup",0x104);
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 == 0,"test_insert_dup",0x10a,
                    "insert duplicate (in dup tree) was not successful");
  cunit_named_check(head.count == 7,"test_insert_dup",0x10d,
                    "tree not completely filled after insert");
  check_tree("test_insert_dup",0x10e);
  cunit_end_test("test_insert_dup");
  cunit_start_test("test_find");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(uVar10 & 0xffffffff),(_Bool)uVar11);
  local_74 = 0;
  do {
    lVar3 = avl_find(&head,nodes + local_74);
    cunit_named_check(lVar3 == (ulong)local_74 * 0x40 + 0x1080f8,"test_find",0x11d,
                      "node of element %d not found");
    lVar3 = avl_find(&head,nodes + local_74);
    cunit_named_check((tree_element *)(lVar3 + -8) == nodes + local_74 && lVar3 != 0,"test_find",
                      0x11e,"element %d not found");
    local_74 = local_74 + 1;
  } while (local_74 < 6);
  local_74 = 0xff;
  lVar3 = avl_find(&head,&local_74);
  cunit_named_check(lVar3 == 0,"test_find",0x121,"non-existing element found: %d",(ulong)local_74);
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 == 0,"test_find",0x126,"insert duplicate (in dup tree) was not successful"
                   );
  local_74 = 0;
  do {
    lVar3 = avl_find(&head,nodes + local_74);
    cunit_named_check(lVar3 != 0,"test_find",0x12a,"element %d not found",(ulong)local_74);
    local_74 = local_74 + 1;
  } while (local_74 < 6);
  local_74 = 0xff;
  lVar3 = avl_find(&head,&local_74);
  uVar13 = 0;
  cunit_named_check(lVar3 == 0,"test_find",0x12d,"non-existing element found: %d",(ulong)local_74);
  cunit_end_test("test_find");
  cunit_start_test("test_delete_nondup");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,0);
  ptVar14 = (tree_element *)(ulong)do_random;
  add_elements(ptVar14,(_Bool)uVar11);
  local_40 = 0x108178;
  avl_remove(&head);
  cunit_named_check(head.count == 5,"test_delete_nondup",0x139,"tree has wrong count after delete");
  check_tree("test_delete_nondup",0x13a);
  cunit_end_test("test_delete_nondup");
  cunit_start_test("test_delete_dup");
  uVar9 = 1;
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  local_70 = (uint)do_random;
  add_elements(ptVar14,(_Bool)uVar11);
  local_58 = 0x1081b0;
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  local_48 = 0x108278;
  iVar2 = avl_insert(&head);
  cunit_named_check(iVar2 == 0,"test_delete_dup",0x148,
                    "insert duplicate (in dup tree) was not successful");
  local_50 = 0x1081b8;
  avl_remove(&head);
  cunit_named_check(head.count == 6,"test_delete_dup",0x14b,
                    "tree has wrong count after delete of one duplicate");
  check_tree("test_delete_dup",0x14c);
  cunit_end_test("test_delete_dup");
  cunit_start_test("test_greaterequal");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements(ptVar14,(_Bool)uVar11);
  avl_remove(&head,local_40);
  local_6c = 2;
  lVar3 = avl_find_greaterequal(&head,&local_6c);
  local_60 = &nodes[1].node.list;
  cunit_named_check(lVar3 == 0x108138,"test_greaterequal",0x15c,"node of element >= 2 not found");
  lVar3 = avl_find_greaterequal(&head,&local_6c);
  local_68 = nodes + 1;
  cunit_named_check(lVar3 == 0x108138,"test_greaterequal",0x15d,"element >= 2 not found");
  local_6c = 3;
  lVar3 = avl_find_greaterequal(&head,&local_6c);
  lVar5 = local_50;
  cunit_named_check(lVar3 == local_50,"test_greaterequal",0x161,"node of element >= 3 not found");
  lVar4 = avl_find_greaterequal(&head,&local_6c);
  lVar3 = local_58;
  cunit_named_check(lVar4 + -8 == local_58 && lVar4 != 0,"test_greaterequal",0x162,
                    "element >= 3 not found");
  local_6c = 4;
  lVar4 = avl_find_greaterequal(&head,&local_6c);
  cunit_named_check(lVar4 == lVar5,"test_greaterequal",0x166,"node of element >= 4 not found");
  lVar5 = avl_find_greaterequal(&head,&local_6c);
  cunit_named_check(lVar5 + -8 == lVar3 && lVar5 != 0,"test_greaterequal",0x167,
                    "element >= 4 not found");
  local_6c = 0xff;
  lVar3 = avl_find_greaterequal(&head,&local_6c);
  cunit_named_check(lVar3 == 0,"test_greaterequal",0x16b,"node of element >= 255 found");
  lVar3 = avl_find_greaterequal(&head,&local_6c);
  cunit_named_check(lVar3 == 0,"test_greaterequal",0x16c,"element >= 255 found");
  additional_node1.value = 4;
  additional_node1.node.key = &additional_node1;
  avl_insert(&head,local_48);
  local_6c = 2;
  plVar6 = (list_entity *)avl_find_greaterequal(&head,&local_6c);
  cunit_named_check(plVar6 == local_60,"test_greaterequal",0x175,
                    "node of element >= 2 not found (d)");
  lVar3 = avl_find_greaterequal(&head,&local_6c);
  cunit_named_check((tree_element *)(lVar3 + -8) == local_68 && lVar3 != 0,"test_greaterequal",0x176
                    ,"element >= 2 not found (d)");
  local_6c = 3;
  lVar3 = avl_find_greaterequal(&head,&local_6c);
  lVar5 = local_50;
  cunit_named_check(lVar3 == local_50,"test_greaterequal",0x17a,"node of element >= 3 not found (d)"
                   );
  lVar4 = avl_find_greaterequal(&head,&local_6c);
  lVar3 = local_58;
  cunit_named_check(lVar4 + -8 == local_58 && lVar4 != 0,"test_greaterequal",0x17b,
                    "element >= 3 not found (d)");
  local_6c = 4;
  lVar4 = avl_find_greaterequal(&head);
  cunit_named_check(lVar4 == lVar5,"test_greaterequal",0x17f,"node of element >= 4 not found (d)");
  lVar5 = avl_find_greaterequal(&head,&local_6c);
  cunit_named_check(lVar5 + -8 == lVar3 && lVar5 != 0,"test_greaterequal",0x180,
                    "element >= 4 not found (d)");
  local_6c = 0xff;
  lVar3 = avl_find_greaterequal(&head);
  cunit_named_check(lVar3 == 0,"test_greaterequal",0x184,"node of element >= 255 found (d)");
  lVar3 = avl_find_greaterequal(&head,&local_6c);
  cunit_named_check(lVar3 == 0,"test_greaterequal",0x185,"element >= 255 found (d)");
  cunit_end_test("test_greaterequal");
  cunit_start_test("test_lessequal");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)local_70,(_Bool)uVar11);
  avl_remove(&head,local_40);
  local_34 = 0;
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar3 == 0,"test_lessequal",0x195,"node of element <= 0 found");
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar3 == 0,"test_lessequal",0x196,"element <= 0 found");
  local_34 = 2;
  plVar7 = (list_entity *)avl_find_lessequal(&head,&local_34);
  plVar6 = local_60;
  cunit_named_check(plVar7 == local_60,"test_lessequal",0x19a,"node of element <= 2 not found");
  lVar3 = avl_find_lessequal(&head,&local_34);
  ptVar14 = local_68;
  cunit_named_check((tree_element *)(lVar3 + -8) == local_68 && lVar3 != 0,"test_lessequal",0x19b,
                    "element <= 2 not found");
  local_34 = 3;
  plVar7 = (list_entity *)avl_find_lessequal(&head,&local_34);
  cunit_named_check(plVar7 == plVar6,"test_lessequal",0x19f,"node of element <= 3 not found");
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check((tree_element *)(lVar3 + -8) == ptVar14 && lVar3 != 0,"test_lessequal",0x1a0,
                    "element <= 3 not found");
  local_34 = 4;
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar3 == local_50,"test_lessequal",0x1a4,"node of element <= 4 not found");
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar3 + -8 == local_58 && lVar3 != 0,"test_lessequal",0x1a5,
                    "element <= 4 not found");
  additional_node1.value = 4;
  additional_node1.node.key = &additional_node1;
  avl_insert(&head,local_48);
  local_34 = 0;
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar3 == 0,"test_lessequal",0x1ae,"node of element <= 0 found (d)");
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar3 == 0,"test_lessequal",0x1af,"element <= 0 found (d)");
  local_34 = 2;
  plVar7 = (list_entity *)avl_find_lessequal(&head,&local_34);
  plVar6 = local_60;
  cunit_named_check(plVar7 == local_60,"test_lessequal",0x1b3,"node of element <= 2 not found (d)");
  lVar3 = avl_find_lessequal(&head,&local_34);
  ptVar14 = local_68;
  cunit_named_check((tree_element *)(lVar3 + -8) == local_68 && lVar3 != 0,"test_lessequal",0x1b4,
                    "element <= 2 not found (d)");
  local_34 = 3;
  plVar7 = (list_entity *)avl_find_lessequal(&head,&local_34);
  cunit_named_check(plVar7 == plVar6,"test_lessequal",0x1b8,"node of element <= 3 not found (d)");
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check((tree_element *)(lVar3 + -8) == ptVar14 && lVar3 != 0,"test_lessequal",0x1b9,
                    "element <= 3 not found (d)");
  local_34 = 4;
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar3 == local_48,"test_lessequal",0x1bd,
                    "node of element <= 4 not found correctly (d)");
  lVar3 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar3 == 0x108278,"test_lessequal",0x1be,"element <= 4 not found correctly (d)")
  ;
  cunit_end_test("test_lessequal");
  cunit_start_test("test_conditions");
  avl_init(&head,avl_comp_uint32,1);
  uVar11 = 0xcd;
  cunit_named_check(head.count == 0,"test_conditions",0x1c7,"tree should be empty");
  uVar8 = local_70;
  add_elements((tree_element *)(ulong)local_70,(_Bool)uVar11);
  cunit_named_check(head.count != 0,"test_conditions",0x1ca,"tree should not be empty");
  cunit_named_check((avl_node *)head.list_head.next == &nodes[0].node,"test_conditions",0x1cc,
                    "element 1 should be first");
  cunit_named_check(head.list_head.next != local_60,"test_conditions",0x1cd,
                    "element 2 should not be first");
  cunit_named_check((avl_node *)head.list_head.prev == &nodes[5].node,"test_conditions",0x1cf,
                    "element %d should be first",6);
  cunit_named_check((avl_node *)head.list_head.prev != &nodes[0].node,"test_conditions",0x1d0,
                    "element 1 should not be first");
  cunit_end_test("test_conditions");
  cunit_start_test("test_element_functions");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar8,(_Bool)uVar11);
  cunit_named_check((avl_node *)head.list_head.next == &nodes[0].node,"test_element_functions",0x1dc
                    ,"Element 1 should be first");
  cunit_named_check((avl_node *)head.list_head.prev == &nodes[5].node,"test_element_functions",0x1dd
                    ,"Element %d should be first",6);
  ptVar14 = local_68;
  cunit_named_check((tree_element *)&nodes[0].node.list.next[-1].prev == local_68,
                    "test_element_functions",0x1df,"Element 2 is not next of element 1");
  cunit_named_check((tree_element *)&nodes[2].node.list.prev[-1].prev == ptVar14,
                    "test_element_functions",0x1e0,"Element 2 is not prev of element 3");
  cunit_end_test("test_element_functions");
  cunit_start_test("test_for_each_macros");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar8,(_Bool)uVar11);
  if ((head.list_head.next)->prev != head.list_head.prev) {
    uVar13 = 0;
    plVar6 = head.list_head.next;
    do {
      cunit_named_check((tree_element *)&plVar6[-1].prev == nodes + uVar13,"test_for_each_macros",
                        0x1ee,"for_each iteration %d failed",(ulong)uVar13);
      uVar13 = uVar13 + 1;
      plVar6 = plVar6->next;
    } while (plVar6->prev != head.list_head.prev);
  }
  cunit_named_check(uVar13 == 6,"test_for_each_macros",0x1f1,"for_each only had %d of %d iterations"
                    ,(ulong)uVar13,6);
  if ((avl_node *)nodes[1].node.list.prev != &nodes[4].node) {
    uVar10 = 1;
    ptVar14 = (tree_element *)0x108130;
    do {
      cunit_named_check(ptVar14 == nodes + uVar10,"test_for_each_macros",0x1f5,
                        "for_element_range iteration %d failed",uVar10);
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      plVar6 = (ptVar14->node).list.next;
      ptVar14 = (tree_element *)&plVar6[-1].prev;
    } while (plVar6->prev != (list_entity *)0x1081f8);
  }
  uVar8 = 0;
  cunit_named_check(uVar9 == 5,"test_for_each_macros",0x1f8,
                    "for_element_range only had %d of %d iterations",(ulong)(uVar9 - 1),4);
  if (nodes[1].node.list.prev == head.list_head.prev) {
    uVar9 = 1;
  }
  else {
    uVar10 = 1;
    ptVar14 = (tree_element *)0x108130;
    do {
      cunit_named_check(ptVar14 == nodes + uVar10,"test_for_each_macros",0x1fc,
                        "element_to_last iteration %d failed",uVar10);
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      plVar6 = (ptVar14->node).list.next;
      ptVar14 = (tree_element *)&plVar6[-1].prev;
    } while (plVar6->prev != head.list_head.prev);
  }
  cunit_named_check(uVar9 == 6,"test_for_each_macros",0x1ff,
                    "element_to_last only had %d of %d iterations",(ulong)(uVar9 - 1),5);
  if ((avl_node *)(head.list_head.next)->prev != &nodes[4].node) {
    uVar10 = 0;
    plVar6 = head.list_head.next;
    do {
      cunit_named_check((tree_element *)&plVar6[-1].prev == nodes + uVar10,"test_for_each_macros",
                        0x203,"first_to_element iteration %d failed",uVar10);
      uVar8 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar8;
      plVar6 = plVar6->next;
    } while ((avl_node *)plVar6->prev != &nodes[4].node);
  }
  uVar9 = 0;
  uVar10 = 5;
  cunit_named_check(uVar8 == 5,"test_for_each_macros",0x206,
                    "first_to_element only had %d of %d iterations",(ulong)(uVar8 - 1),5);
  cunit_end_test("test_for_each_macros");
  cunit_start_test("test_for_each_reverse_macros");
  uVar11 = 0x28;
  uVar8 = 1;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)local_70,(_Bool)uVar11);
  if ((head.list_head.prev)->next != head.list_head.next) {
    uVar9 = 0;
    plVar6 = head.list_head.prev;
    do {
      cunit_named_check((tree_element *)&plVar6[-1].prev == nodes + uVar10,
                        "test_for_each_reverse_macros",0x215,"for_each iteration %d failed",
                        (ulong)uVar9);
      uVar9 = uVar9 + 1;
      uVar10 = (ulong)((int)uVar10 - 1);
      plVar6 = plVar6->prev;
    } while (plVar6->next != head.list_head.next);
  }
  cunit_named_check(uVar9 == 6,"test_for_each_reverse_macros",0x219,
                    "for_each only had %d of %d iterations",(ulong)uVar9,6);
  if ((avl_node *)nodes[4].node.list.next != &nodes[1].node) {
    uVar9 = 4;
    uVar8 = 1;
    ptVar14 = nodes + 4;
    do {
      cunit_named_check(ptVar14 == nodes + uVar9,"test_for_each_reverse_macros",0x21e,
                        "for_element_range iteration %d failed",(ulong)uVar8);
      uVar8 = uVar8 + 1;
      uVar9 = uVar9 - 1;
      plVar6 = (ptVar14->node).list.prev;
      ptVar14 = (tree_element *)&plVar6[-1].prev;
    } while (plVar6->next != (list_entity *)0x108138);
  }
  uVar9 = 0;
  cunit_named_check(uVar8 == 5,"test_for_each_reverse_macros",0x222,
                    "for_element_range only had %d of %d iterations",(ulong)(uVar8 - 1),4);
  if ((head.list_head.prev)->next == (list_entity *)0x108138) {
    uVar8 = 1;
  }
  else {
    uVar10 = 5;
    uVar8 = 1;
    plVar6 = head.list_head.prev;
    do {
      cunit_named_check((tree_element *)&plVar6[-1].prev == nodes + uVar10,
                        "test_for_each_reverse_macros",0x227,"element_to_last iteration %d failed",
                        (ulong)uVar8);
      uVar8 = uVar8 + 1;
      uVar10 = (ulong)((int)uVar10 - 1);
      plVar6 = plVar6->prev;
    } while (plVar6->next != (list_entity *)0x108138);
  }
  cunit_named_check(uVar8 == 6,"test_for_each_reverse_macros",0x22b,
                    "element_to_last only had %d of %d iterations",(ulong)(uVar8 - 1),5);
  if (nodes[4].node.list.next != head.list_head.next) {
    uVar10 = 4;
    ptVar14 = nodes + 4;
    uVar9 = 0;
    do {
      cunit_named_check(ptVar14 == nodes + uVar10,"test_for_each_reverse_macros",0x230,
                        "first_to_element iteration %d failed",(ulong)uVar9);
      uVar9 = uVar9 + 1;
      uVar10 = (ulong)((int)uVar10 - 1);
      plVar6 = (ptVar14->node).list.prev;
      ptVar14 = (tree_element *)&plVar6[-1].prev;
    } while (plVar6->next != head.list_head.next);
  }
  uVar8 = 0;
  cunit_named_check(uVar9 == 5,"test_for_each_reverse_macros",0x234,
                    "first_to_element only had %d of %d iterations",(ulong)(uVar9 - 1),5);
  cunit_end_test("test_for_each_reverse_macros");
  cunit_start_test("test_for_each_save_macro");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)local_70,(_Bool)uVar11);
  uVar10 = 0;
  if ((head.list_head.next)->prev != head.list_head.prev) {
    uVar10 = 0;
    plVar6 = head.list_head.next;
    do {
      plVar7 = plVar6->next;
      cunit_named_check((tree_element *)&plVar6[-1].prev == nodes + uVar10,
                        "test_for_each_save_macro",0x243,"for_each_save iteration %d failed",uVar10)
      ;
      avl_remove(&head,plVar6);
      uVar10 = (ulong)((int)uVar10 + 1);
      plVar6 = plVar7;
    } while (plVar7->prev != head.list_head.prev);
  }
  cunit_named_check((int)uVar10 == 6,"test_for_each_save_macro",0x247,
                    "for_each_save only had %d of %d iterations",uVar10,6);
  cunit_named_check(head.count == 0,"test_for_each_save_macro",0x248,
                    "for_each_save tree not empty after loop with delete");
  cunit_end_test("test_for_each_save_macro");
  cunit_start_test("test_for_each_reverse_save_macro");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)local_70,(_Bool)uVar11);
  if ((head.list_head.prev)->next != head.list_head.next) {
    uVar10 = 5;
    uVar8 = 0;
    plVar6 = head.list_head.prev;
    do {
      plVar7 = plVar6->prev;
      cunit_named_check((tree_element *)&plVar6[-1].prev == nodes + uVar10,
                        "test_for_each_reverse_save_macro",599,"for_each_save iteration %d failed",
                        (ulong)uVar8);
      avl_remove(&head,plVar6);
      uVar8 = uVar8 + 1;
      uVar10 = (ulong)((int)uVar10 - 1);
      plVar6 = plVar7;
    } while (plVar7->next != head.list_head.next);
  }
  uVar9 = 0;
  cunit_named_check(uVar8 == 6,"test_for_each_reverse_save_macro",0x25c,
                    "for_each_save only had %d of %d iterations",(ulong)uVar8,6);
  cunit_named_check(head.count == 0,"test_for_each_reverse_save_macro",0x25d,
                    "for_each_save tree not empty after loop with delete");
  cunit_end_test("test_for_each_reverse_save_macro");
  cunit_start_test("test_remove_all_macro");
  uVar11 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)local_70,(_Bool)uVar11);
  plVar6 = head.list_head.next;
  pplVar1 = &(head.list_head.next)->next;
  head.list_head.prev = &head.list_head;
  head.list_head.next = &head.list_head;
  head.root = (avl_node *)0x0;
  if (head.count != 0) {
    uVar10 = 0;
    plVar7 = *pplVar1;
    do {
      cunit_named_check((tree_element *)&plVar6[-1].prev == nodes + uVar10,"test_remove_all_macro",
                        0x26b,"for_each_save iteration %u failed",uVar10);
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      head.count = head.count - 1;
      plVar6 = plVar7;
      plVar7 = plVar7->next;
    } while (head.count != 0);
  }
  cunit_named_check(uVar9 == 6,"test_remove_all_macro",0x26e,
                    "remove_all only had %u of %u iterations",(ulong)uVar9,6);
  cunit_named_check(head.count == 0,"test_remove_all_macro",0x26f,
                    "remove_all tree not empty after loop with delete");
  check_tree("test_remove_all_macro",0x271);
  cunit_end_test("test_remove_all_macro");
  return;
}

Assistant:

static void do_tests(bool do_random) {
  printf("Do %srandom tests.\n", do_random ? "" : "non ");

  test_insert_nondup(do_random);
  test_insert_dup(do_random);
  test_find(do_random);
  test_delete_nondup(do_random);
  test_delete_dup(do_random);
  test_greaterequal(do_random);
  test_lessequal(do_random);
  test_conditions(do_random);
  test_element_functions(do_random);
  test_for_each_macros(do_random);
  test_for_each_reverse_macros(do_random);
  test_for_each_save_macro(do_random);
  test_for_each_reverse_save_macro(do_random);
  test_remove_all_macro(do_random);
}